

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_div_2d(mp_int *a,int b,mp_int *c,mp_int *d)

{
  ulong uVar1;
  byte bVar2;
  mp_int *in_RCX;
  mp_int *in_RDX;
  int in_ESI;
  mp_digit shift;
  mp_digit mask;
  mp_digit *tmpc;
  mp_int t;
  int res;
  int x;
  mp_digit rr;
  mp_digit r;
  mp_digit D;
  mp_int *in_stack_ffffffffffffff78;
  mp_int *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int b_00;
  mp_int *in_stack_ffffffffffffff90;
  mp_int *in_stack_ffffffffffffff98;
  ulong *puVar3;
  int in_stack_ffffffffffffffa4;
  mp_int *in_stack_ffffffffffffffa8;
  int local_44;
  ulong local_38;
  int local_4;
  
  b_00 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_ESI < 1) {
    local_4 = mp_copy(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (in_RCX != (mp_int *)0x0) {
      mp_zero(in_RCX);
    }
  }
  else {
    local_4 = mp_init(in_stack_ffffffffffffff78);
    if (local_4 == 0) {
      if ((in_RCX == (mp_int *)0x0) ||
         (local_4 = mp_mod_2d(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                              in_stack_ffffffffffffff98), local_4 == 0)) {
        local_4 = mp_copy(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (local_4 == 0) {
          if (0x3b < in_ESI) {
            mp_rshd(in_stack_ffffffffffffff90,b_00);
          }
          if (in_ESI % 0x3c != 0) {
            bVar2 = (byte)(in_ESI % 0x3c);
            puVar3 = in_RDX->dp + (in_RDX->used + -1);
            local_38 = 0;
            local_44 = in_RDX->used;
            while (local_44 = local_44 + -1, -1 < local_44) {
              uVar1 = *puVar3;
              in_stack_ffffffffffffff80 = (mp_int *)(*puVar3 >> (bVar2 & 0x3f));
              *puVar3 = (ulong)in_stack_ffffffffffffff80 | local_38 << (0x3c - bVar2 & 0x3f);
              puVar3 = puVar3 + -1;
              local_38 = uVar1 & (1L << (bVar2 & 0x3f)) - 1U;
            }
          }
          mp_clamp(in_RDX);
          if (in_RCX != (mp_int *)0x0) {
            mp_exch((mp_int *)&stack0xffffffffffffffa0,in_RCX);
          }
          mp_clear(in_stack_ffffffffffffff80);
          local_4 = 0;
        }
        else {
          mp_clear(in_stack_ffffffffffffff80);
        }
      }
      else {
        mp_clear(in_stack_ffffffffffffff80);
      }
    }
  }
  return local_4;
}

Assistant:

int mp_div_2d (mp_int * a, int b, mp_int * c, mp_int * d)
{
  mp_digit D, r, rr;
  int     x, res;
  mp_int  t;


  /* if the shift count is <= 0 then we do no work */
  if (b <= 0) {
    res = mp_copy (a, c);
    if (d != NULL) {
      mp_zero (d);
    }
    return res;
  }

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  /* get the remainder */
  if (d != NULL) {
    if ((res = mp_mod_2d (a, b, &t)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    mp_rshd (c, b / DIGIT_BIT);
  }

  /* shift any bit count < DIGIT_BIT */
  D = (mp_digit) (b % DIGIT_BIT);
  if (D != 0) {
    register mp_digit *tmpc, mask, shift;

    /* mask */
    mask = (((mp_digit)1) << D) - 1;

    /* shift for lsb */
    shift = DIGIT_BIT - D;

    /* alias */
    tmpc = c->dp + (c->used - 1);

    /* carry */
    r = 0;
    for (x = c->used - 1; x >= 0; x--) {
      /* get the lower  bits of this word in a temp */
      rr = *tmpc & mask;

      /* shift the current word and mix in the carry bits from the previous word */
      *tmpc = (*tmpc >> D) | (r << shift);
      --tmpc;

      /* set the carry to the carry bits of the current word found above */
      r = rr;
    }
  }
  mp_clamp (c);
  if (d != NULL) {
    mp_exch (&t, d);
  }
  mp_clear (&t);
  return MP_OKAY;
}